

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string_view __thiscall
bloaty::RangeSink::ZlibDecompress(RangeSink *this,string_view data,uint64_t uncompressed_size)

{
  Arena *this_00;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong n;
  string_view sVar4;
  uLongf zliblen;
  uint64_t local_30;
  
  sVar3 = data._M_len;
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    Throw("This range sink isn\'t prepared to zlib decompress.",0x568);
  }
  if (sVar3 * 0x1e + 0x8000000 < uncompressed_size) {
    pcVar2 = (char *)0x0;
    fprintf(_stderr,
            "warning: ignoring compressed debug data, implausible uncompressed size (compressed: %zu, uncompressed: %lu)\n"
            ,sVar3,uncompressed_size);
    local_30 = 0;
  }
  else {
    n = uncompressed_size + 7 & 0xfffffffffffffff8;
    google::protobuf::Arena::AllocHook(this_00,(type_info *)&unsigned_char::typeinfo,n);
    pcVar2 = (char *)google::protobuf::internal::ArenaImpl::AllocateAligned(&this_00->impl_,n);
    local_30 = uncompressed_size;
    iVar1 = uncompress(pcVar2,&local_30,data._M_str,sVar3);
    if (iVar1 != 0) {
      Throw("Error decompressing debug info",0x57a);
    }
  }
  sVar4._M_str = pcVar2;
  sVar4._M_len = local_30;
  return sVar4;
}

Assistant:

std::string_view RangeSink::ZlibDecompress(std::string_view data,
                                            uint64_t uncompressed_size) {
  if (!arena_) {
    THROW("This range sink isn't prepared to zlib decompress.");
  }
  uint64_t mb = 1 << 20;
  // Limit for uncompressed size is 30x the compressed size + 128MB.
  if (uncompressed_size >
      static_cast<uint64_t>(data.size()) * 30 + (128 * mb)) {
    fprintf(stderr,
            "warning: ignoring compressed debug data, implausible uncompressed "
            "size (compressed: %zu, uncompressed: %" PRIu64 ")\n",
            data.size(), uncompressed_size);
    return std::string_view();
  }
  unsigned char* dbuf =
      arena_->google::protobuf::Arena::CreateArray<unsigned char>(
          arena_, uncompressed_size);
  uLongf zliblen = uncompressed_size;
  if (uncompress(dbuf, &zliblen, (unsigned char*)(data.data()), data.size()) !=
      Z_OK) {
    THROW("Error decompressing debug info");
  }
  string_view sv(reinterpret_cast<char*>(dbuf), zliblen);
  return sv;
}